

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O0

IntrinsicResult intrinsic_rawDataResize(Context *context,IntrinsicResult *partialResult)

{
  bool bVar1;
  int32_t iVar2;
  size_t sVar3;
  RawDataHandleStorage *this;
  anon_union_8_3_2f476f46_for_data *msg;
  RawDataHandleStorage *storage;
  Value local_e8;
  Value local_d8;
  undefined1 local_c8 [8];
  Value dataWrapper;
  IndexException local_a8;
  String local_78;
  undefined1 local_68 [24];
  long nBytes;
  Value self;
  IntrinsicResult *partialResult_local;
  Context *context_local;
  
  MiniScript::String::String((String *)&stack0xffffffffffffffc0,"self");
  MiniScript::Context::GetVar
            ((Context *)&stack0xffffffffffffffd0,(String *)partialResult,
             (LocalOnlyMode)(String *)&stack0xffffffffffffffc0);
  MiniScript::String::~String((String *)&stack0xffffffffffffffc0);
  MiniScript::String::String(&local_78,"bytes");
  MiniScript::Context::GetVar((Context *)local_68,(String *)partialResult,(LocalOnlyMode)&local_78);
  iVar2 = MiniScript::Value::IntValue((Value *)local_68);
  sVar3 = (size_t)iVar2;
  MiniScript::Value::~Value((Value *)local_68);
  MiniScript::String::~String(&local_78);
  local_68._16_8_ = sVar3;
  if ((long)sVar3 < 0) {
    MiniScript::String::String((String *)&dataWrapper.data,"bytes parameter must be >= 0");
    msg = &dataWrapper.data;
    MiniScript::IndexException::IndexException(&local_a8,(String *)msg);
    MiniScript::IndexException::raise(&local_a8,(int)msg);
    MiniScript::IndexException::~IndexException(&local_a8);
    MiniScript::String::~String((String *)&dataWrapper.data);
  }
  MiniScript::Value::Value(&local_d8,&_handle);
  MiniScript::Value::Lookup((Value *)local_c8,(Value *)&stack0xffffffffffffffd0);
  MiniScript::Value::~Value(&local_d8);
  bVar1 = MiniScript::Value::IsNull((Value *)local_c8);
  if ((bVar1) || (local_c8[0] != Handle)) {
    this = (RawDataHandleStorage *)operator_new(0x20);
    RawDataHandleStorage::RawDataHandleStorage(this);
    MiniScript::Value::NewHandle(&local_e8,(RefCountedStorage *)this);
    MiniScript::Value::operator=((Value *)local_c8,&local_e8);
    MiniScript::Value::~Value(&local_e8);
    MiniScript::Value::GetDict((ValueDict *)&storage,(Value *)&stack0xffffffffffffffd0);
    MiniScript::Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::SetValue
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)&storage,
               &_handle,(Value *)local_c8);
    MiniScript::Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::
    ~Dictionary((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)&storage
               );
  }
  RawDataHandleStorage::resize((RawDataHandleStorage *)dataWrapper._0_8_,local_68._16_8_);
  MiniScript::IntrinsicResult::IntrinsicResult
            ((IntrinsicResult *)context,(IntrinsicResult *)&MiniScript::IntrinsicResult::Null);
  MiniScript::Value::~Value((Value *)local_c8);
  MiniScript::Value::~Value((Value *)&stack0xffffffffffffffd0);
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_rawDataResize(Context *context, IntrinsicResult partialResult) {
	Value self = context->GetVar("self");
	long nBytes = context->GetVar("bytes").IntValue();
	if (nBytes < 0) {
		IndexException(String("bytes parameter must be >= 0")).raise();
	}
	Value dataWrapper = self.Lookup(_handle);
	if (dataWrapper.IsNull() or dataWrapper.type != ValueType::Handle) {
		dataWrapper = Value::NewHandle(new RawDataHandleStorage());
		self.GetDict().SetValue(_handle, dataWrapper);
	}
	RawDataHandleStorage *storage = (RawDataHandleStorage*)dataWrapper.data.ref;
	storage->resize(nBytes);
	return IntrinsicResult::Null;
}